

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O0

VkDescriptorSetLayout __thiscall
vkt::image::anon_unknown_0::BufferLoadStoreTestInstance::prepareDescriptors
          (BufferLoadStoreTestInstance *this)

{
  RefData<vk::Handle<(vk::HandleType)19>_> data;
  RefData<vk::Handle<(vk::HandleType)21>_> data_00;
  RefData<vk::Handle<(vk::HandleType)22>_> data_01;
  RefData<vk::Handle<(vk::HandleType)12>_> data_02;
  RefData<vk::Handle<(vk::HandleType)12>_> data_03;
  VkDevice pVVar1;
  VkDevice pVVar2;
  DescriptorSetLayoutBuilder *pDVar3;
  DescriptorPoolBuilder *pDVar4;
  Handle<(vk::HandleType)21> *pHVar5;
  Handle<(vk::HandleType)19> *pHVar6;
  Buffer *pBVar7;
  VkBuffer *pVVar8;
  Move<vk::Handle<(vk::HandleType)12>_> local_1f0;
  RefData<vk::Handle<(vk::HandleType)12>_> local_1d0;
  deUint64 local_1b0;
  Move<vk::Handle<(vk::HandleType)12>_> local_1a8;
  RefData<vk::Handle<(vk::HandleType)12>_> local_188;
  deUint64 local_168;
  VkDescriptorPool local_160;
  Move<vk::Handle<(vk::HandleType)22>_> local_158;
  RefData<vk::Handle<(vk::HandleType)22>_> local_138;
  DescriptorPoolBuilder local_118;
  Move<vk::Handle<(vk::HandleType)21>_> local_100;
  RefData<vk::Handle<(vk::HandleType)21>_> local_e0;
  DescriptorSetLayoutBuilder local_b0;
  Move<vk::Handle<(vk::HandleType)19>_> local_68;
  RefData<vk::Handle<(vk::HandleType)19>_> local_48;
  VkDevice local_28;
  VkDevice device;
  DeviceInterface *vk;
  BufferLoadStoreTestInstance *this_local;
  
  vk = (DeviceInterface *)this;
  device = (VkDevice)
           Context::getDeviceInterface
                     ((this->super_LoadStoreTestInstance).super_BaseTestInstance.super_TestInstance.
                      m_context);
  local_28 = Context::getDevice((this->super_LoadStoreTestInstance).super_BaseTestInstance.
                                super_TestInstance.m_context);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(&local_b0);
  pDVar3 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                     (&local_b0,VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER,0x20);
  pDVar3 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                     (pDVar3,VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER,0x20);
  ::vk::DescriptorSetLayoutBuilder::build(&local_68,pDVar3,(DeviceInterface *)device,local_28,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_48,(Move *)&local_68);
  data.deleter.m_deviceIface = local_48.deleter.m_deviceIface;
  data.object.m_internal = local_48.object.m_internal;
  data.deleter.m_device = local_48.deleter.m_device;
  data.deleter.m_allocator = local_48.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::operator=
            (&this->m_descriptorSetLayout,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move(&local_68);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder(&local_b0);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder(&local_118);
  pDVar4 = ::vk::DescriptorPoolBuilder::addType
                     (&local_118,VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER,1);
  pDVar4 = ::vk::DescriptorPoolBuilder::addType(pDVar4,VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build(&local_100,pDVar4,(DeviceInterface *)device,local_28,1,1);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_e0,(Move *)&local_100);
  data_00.deleter.m_deviceIface = local_e0.deleter.m_deviceIface;
  data_00.object.m_internal = local_e0.object.m_internal;
  data_00.deleter.m_device = local_e0.deleter.m_device;
  data_00.deleter.m_allocator = local_e0.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::operator=
            (&this->m_descriptorPool,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move(&local_100);
  ::vk::DescriptorPoolBuilder::~DescriptorPoolBuilder(&local_118);
  pVVar2 = device;
  pVVar1 = local_28;
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                     (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>);
  local_160.m_internal = pHVar5->m_internal;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                     (&(this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>)
  ;
  local_168 = pHVar6->m_internal;
  makeDescriptorSet(&local_158,(DeviceInterface *)pVVar2,pVVar1,local_160,
                    (VkDescriptorSetLayout)local_168);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_138,(Move *)&local_158);
  data_01.deleter.m_deviceIface = local_138.deleter.m_deviceIface;
  data_01.object.m_internal = local_138.object.m_internal;
  data_01.deleter.m_device = local_138.deleter.m_device;
  data_01.deleter.m_pool.m_internal = local_138.deleter.m_pool.m_internal;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::operator=(&this->m_descriptorSet,data_01)
  ;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_158);
  pVVar2 = device;
  pVVar1 = local_28;
  pBVar7 = de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::
           operator->(&(this->super_LoadStoreTestInstance).m_imageBuffer.
                       super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>
                     );
  pVVar8 = image::Buffer::get(pBVar7);
  local_1b0 = pVVar8->m_internal;
  makeBufferView(&local_1a8,(DeviceInterface *)pVVar2,pVVar1,(VkBuffer)local_1b0,
                 (this->super_LoadStoreTestInstance).super_BaseTestInstance.m_format,0,
                 (this->super_LoadStoreTestInstance).m_imageSizeBytes);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_188,(Move *)&local_1a8);
  data_02.deleter.m_deviceIface = local_188.deleter.m_deviceIface;
  data_02.object.m_internal = local_188.object.m_internal;
  data_02.deleter.m_device = local_188.deleter.m_device;
  data_02.deleter.m_allocator = local_188.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)12>_>::operator=(&this->m_bufferViewSrc,data_02)
  ;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)12>_>::~Move(&local_1a8);
  pVVar2 = device;
  pVVar1 = local_28;
  pBVar7 = de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::
           operator->(&(this->m_imageBufferDst).
                       super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>
                     );
  pVVar8 = image::Buffer::get(pBVar7);
  makeBufferView(&local_1f0,(DeviceInterface *)pVVar2,pVVar1,(VkBuffer)pVVar8->m_internal,
                 (this->super_LoadStoreTestInstance).super_BaseTestInstance.m_format,0,
                 (this->super_LoadStoreTestInstance).m_imageSizeBytes);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1d0,(Move *)&local_1f0);
  data_03.deleter.m_deviceIface = local_1d0.deleter.m_deviceIface;
  data_03.object.m_internal = local_1d0.object.m_internal;
  data_03.deleter.m_device = local_1d0.deleter.m_device;
  data_03.deleter.m_allocator = local_1d0.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)12>_>::operator=(&this->m_bufferViewDst,data_03)
  ;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)12>_>::~Move(&local_1f0);
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                     (&(this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>)
  ;
  return (VkDescriptorSetLayout)pHVar6->m_internal;
}

Assistant:

VkDescriptorSetLayout BufferLoadStoreTestInstance::prepareDescriptors (void)
{
	const DeviceInterface&	vk		= m_context.getDeviceInterface();
	const VkDevice			device	= m_context.getDevice();

	m_descriptorSetLayout = DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(vk, device);

	m_descriptorPool = DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER)
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u);

	m_descriptorSet = makeDescriptorSet(vk, device, *m_descriptorPool, *m_descriptorSetLayout);
	m_bufferViewSrc = makeBufferView(vk, device, m_imageBuffer->get(), m_format, 0ull, m_imageSizeBytes);
	m_bufferViewDst = makeBufferView(vk, device, m_imageBufferDst->get(), m_format, 0ull, m_imageSizeBytes);

	return *m_descriptorSetLayout;  // not passing the ownership
}